

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O3

RC __thiscall QL_NodeRel::RetrieveNextRec(QL_NodeRel *this,RM_Record *rec,char **recData)

{
  int iVar1;
  RID rid;
  RID local_30;
  
  if (this->useIndex == true) {
    RID::RID(&local_30);
    iVar1 = yyparse();
    if (iVar1 != 0) {
      RID::~RID(&local_30);
      return iVar1;
    }
    iVar1 = RM_FileHandle::GetRec(&this->fh,&local_30,rec);
    RID::~RID(&local_30);
  }
  else {
    iVar1 = RM_FileScan::GetNextRec(&this->fs,rec);
  }
  if (iVar1 == 0) {
    iVar1 = RM_Record::GetData(rec,recData);
  }
  return iVar1;
}

Assistant:

RC QL_NodeRel::RetrieveNextRec(RM_Record &rec, char *&recData){
  RC rc = 0;
  if(useIndex){
    RID rid;
    if((rc = is.GetNextEntry(rid) ))
      return (rc);
    if((rc = fh.GetRec(rid, rec) ))
      return (rc);
  }
  else{
    if((rc = fs.GetNextRec(rec)))
      return (rc);
  }
  if((rc = rec.GetData(recData)))
    return (rc);
  return (0);
}